

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::interpret(Forth *this)

{
  bool bVar1;
  int iVar2;
  Cell CVar3;
  Definition *pDVar4;
  size_type sVar5;
  Definition local_b0;
  Definition *local_60;
  Definition *defn;
  size_type qty;
  bool refillFlag;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string currentWord;
  Xt xt;
  Forth *this_local;
  
  currentWord.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,0x21,'\0',&local_39);
  std::allocator<char>::~allocator(&local_39);
  do {
    do {
      if (this->InterpretState != InterpretSource) goto LAB_0015f40e;
      skipSpacesInSource(this);
      iVar2 = getSourceBufferRemain(this);
      if (iVar2 < 1) {
        qty._3_1_ = refillNextLine(this);
        if (!(bool)qty._3_1_) {
          defn = (Definition *)
                 std::
                 vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                 ::size(&this->savedInput);
          if (defn == (Definition *)0x0) {
            std::__cxx11::string::~string((string *)local_38);
            return;
          }
          RestoreInput(this);
          if ((this->InterpretState == InterpretWords) && (this->next_command != 0)) {
            currentWord.field_2._12_4_ = getDataCell(this,this->next_command);
            this->next_command = this->next_command + 4;
          }
        }
        goto LAB_0015f40e;
      }
      currentWord.field_2._12_4_ = blWordFind(this,(string *)local_38);
      if (currentWord.field_2._12_4_ != 0) {
        CVar3 = getIsCompiling(this);
        if (CVar3 != 0) {
          pDVar4 = getDefinition(this,currentWord.field_2._12_4_);
          bVar1 = Definition::isImmediate(pDVar4);
          if (!bVar1) {
            data(this,currentWord.field_2._12_4_);
            goto LAB_0015f40e;
          }
        }
        this->InterpretState = InterpretWords;
        goto LAB_0015f40e;
      }
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38);
    } while (sVar5 == 0);
    bVar1 = interpretNumbers(this,(string *)local_38);
    if (!bVar1) {
      push(this,0xfffffff3);
      exceptionsThrow(this);
      currentWord.field_2._12_4_ = getDataCell(this,this->next_command);
      this->next_command = this->next_command + 4;
    }
LAB_0015f40e:
    if (this->InterpretState == InterpretWords) {
      local_60 = getDefinition(this,currentWord.field_2._12_4_);
      while ((code *)local_60->code == execute &&
             ((code *)local_60->code == (code *)0x0 || *(long *)&local_60->field_0x8 == 0)) {
        requireDStackDepth(this,1,"EXECUTE");
        currentWord.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
        ForthStack<unsigned_int>::pop(&this->dStack);
        local_60 = getDefinition(this,currentWord.field_2._12_4_);
      }
      pDVar4 = getDefinition(this,currentWord.field_2._12_4_);
      Definition::Definition(&local_b0,pDVar4);
      executeDefinition(this,&local_b0);
      Definition::~Definition(&local_b0);
      if (this->next_command == 0) {
        this->InterpretState = InterpretSource;
      }
      else {
        currentWord.field_2._12_4_ = getDataCell(this,this->next_command);
        this->next_command = this->next_command + 4;
      }
      if (this->next_command == 0) {
        this->InterpretState = InterpretSource;
      }
    }
  } while( true );
}

Assistant:

void interpret() {
			Xt xt{};
			std::string currentWord(33,0); // reserve at least 33 chars in word
			while (true){
				if (InterpretState == InterpretSource){
					skipSpacesInSource();
					if (getSourceBufferRemain() >0 ) {
						xt=blWordFind(currentWord);
						if (xt>0) {
							if (getIsCompiling() && !getDefinition(xt)->isImmediate()) {
								data(CELL(xt));
							}
							else {
								InterpretState = InterpretWords;
							}
						}
						else {
							if (currentWord.size() > 0) {
								if (!interpretNumbers(currentWord)){
									// uncomment during debug if information is needed about wrong words
									//std::cerr << "!!!Wrong word "<<currentWord<<std::endl;
									push(CELL(-13));
									exceptionsThrow();
									xt = getDataCell(next_command);
									next_command += sizeof(next_command);
								}
							}
							else {
								// read buffer empty
								// on next cycle go to 'refill' branch
								continue;
							}
						}
					}
					else {
						// 'refill' branch
						auto refillFlag = refillNextLine();
						// input sorce empty (no lines in input buffer, no lines in file, 
						// evaluate source ended, block ended) ?
						if (!refillFlag){  
							auto qty = savedInput.size();  	// if empty, check saved input sources
							if (qty > 0){					// if have saved source - restore it and run
								RestoreInput();
								if (InterpretState == InterpretWords){
									if (next_command != 0){
										xt = getDataCell(next_command);
										next_command += sizeof(next_command);
									}
								}
							}
							else {
								break; // all input buffers are empty. break and return from interpret()
							}
						}
					}
				}
				if (InterpretState == InterpretWords){
					auto defn = getDefinition(xt);
					while (defn->code == &Forth::execute) {
						REQUIRE_DSTACK_DEPTH(1, "EXECUTE");
						xt = dStack.getTop(); dStack.pop();
						defn = getDefinition(xt);
					}
#ifdef FORTHSCRIPTCPP_ENABLE_INTERNALDEBUGGER
					if (stepfunction){
						if (currentstep-- == 0){
							stepfunction(this, xt, next_command);
							currentstep = maxstep;
						}
					}
#endif
					executeDefinition(*getDefinition(xt));
					if (next_command == 0){
						InterpretState = InterpretSource;
					}
					else {
						xt = getDataCell(next_command);
						next_command += sizeof(next_command);
					}
					if (next_command == 0){
						InterpretState = InterpretSource;
					}
				}
			}
		}